

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CiA402DeviceICanbus.cpp
# Opt level: O2

long __thiscall CiA402DeviceICanbus::c2co(CiA402DeviceICanbus *this,can_msg *input,co_msg *output)

{
  short sVar1;
  int i;
  long lVar2;
  
  output->dlc_co = (input->field_0).fi & 0xf;
  sVar1 = (short)input->id;
  (output->field_0).id_co = sVar1 * 2;
  (output->field_0).id_co = ((input->field_0).fi >> 4 & 1) + sVar1 * 2;
  output->ts = input->ts;
  for (lVar2 = 0; lVar2 != 8; lVar2 = lVar2 + 1) {
    output->data_co[lVar2] = input->data[lVar2];
  }
  return 0;
}

Assistant:

long CiA402DeviceICanbus::c2co(const can_msg & input, co_msg & output)
{

   //verificar el bit de start to frame de can

    output.dlc_co=input.dlc;
    output.id_co=input.id;
    output.id_co<<=1;
    output.rtr=input.rtr;
    output.ts=input.ts;


    for( int i=0; i < 8; i++)
    {
        output.data_co[i] = input.data[i];
    }

    return 0;
}